

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O2

nng_err nni_http_handler_init(nni_http_handler **hp,char *uri,nng_http_handler_func cb)

{
  nni_http_handler *pnVar1;
  nng_err nVar2;
  
  pnVar1 = (nni_http_handler *)nni_zalloc(0x5f8);
  if (pnVar1 == (nni_http_handler *)0x0) {
    nVar2 = NNG_ENOMEM;
  }
  else {
    nni_atomic_init(&pnVar1->ref);
    nni_atomic_inc(&pnVar1->ref);
    if (((uri == (char *)0x0) || (*uri == '\0')) || ((*uri == '/' && (uri[1] == '\0')))) {
      uri = "";
    }
    nVar2 = NNG_OK;
    snprintf(pnVar1->uri,0x400,"%s",uri);
    (pnVar1->node).ln_next = (nni_list_node *)0x0;
    (pnVar1->node).ln_prev = (nni_list_node *)0x0;
    pnVar1->cb = cb;
    pnVar1->tree = false;
    pnVar1->data = (void *)0x0;
    pnVar1->dtor = (nni_cb)0x0;
    pnVar1->maxbody = 0x100000;
    pnVar1->getbody = true;
    builtin_strncpy(pnVar1->method,"GET",4);
    pnVar1->host[0] = '\0';
    *hp = pnVar1;
  }
  return nVar2;
}

Assistant:

nng_err
nni_http_handler_init(
    nni_http_handler **hp, const char *uri, nng_http_handler_func cb)
{
	nni_http_handler *h;

	if ((h = NNI_ALLOC_STRUCT(h)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_atomic_init(&h->ref);
	nni_atomic_inc(&h->ref);

	// Default for HTTP is /.  But remap it to "" for ease of matching.
	if ((uri == NULL) || (strlen(uri) == 0) || (strcmp(uri, "/") == 0)) {
		uri = "";
	}
	(void) snprintf(h->uri, sizeof(h->uri), "%s", uri);
	NNI_LIST_NODE_INIT(&h->node);
	h->cb      = cb;
	h->data    = NULL;
	h->dtor    = NULL;
	h->tree    = false;
	h->maxbody = 1024 * 1024; // Up to 1MB of body
	h->getbody = true;
	(void) strcpy(h->method, "GET");
	(void) strcpy(h->host, "");
	*hp = h;
	return (NNG_OK);
}